

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O0

uint32_t __thiscall
llvm::DWARFDebugLine::LineTable::lookupAddress(LineTable *this,SectionedAddress Address)

{
  SectionedAddress Address_00;
  uint32_t Result;
  LineTable *this_local;
  SectionedAddress Address_local;
  
  Address_local.SectionIndex._4_4_ = lookupAddressImpl(this,Address);
  if ((Address_local.SectionIndex._4_4_ == this->UnknownRowIndex) &&
     (Address.SectionIndex != 0xffffffffffffffff)) {
    Address_00.SectionIndex = 0xffffffffffffffff;
    Address_00.Address = Address.Address;
    Address_local.SectionIndex._4_4_ = lookupAddressImpl(this,Address_00);
  }
  return Address_local.SectionIndex._4_4_;
}

Assistant:

uint32_t DWARFDebugLine::LineTable::lookupAddress(
    object::SectionedAddress Address) const {

  // Search for relocatable addresses
  uint32_t Result = lookupAddressImpl(Address);

  if (Result != UnknownRowIndex ||
      Address.SectionIndex == object::SectionedAddress::UndefSection)
    return Result;

  // Search for absolute addresses
  Address.SectionIndex = object::SectionedAddress::UndefSection;
  return lookupAddressImpl(Address);
}